

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O3

void * __thiscall
chrono::ChClassRegistration<chrono::ChKblockGeneric>::create
          (ChClassRegistration<chrono::ChKblockGeneric> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0x38);
  *puVar1 = &PTR__ChKblockGeneric_00b3a868;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  return puVar1;
}

Assistant:

virtual void* create() {
        return _create();
    }